

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD2Importer::ValidateHeader(MD2Importer *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Header *pHVar4;
  Logger *pLVar5;
  runtime_error *prVar6;
  size_t sVar7;
  ulong uVar8;
  char szBuffer [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char local_45 [4];
  undefined1 local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pHVar4 = this->m_pcHeader;
  if ((pHVar4->magic != 0x32504449) && (pHVar4->magic != 0x49445032)) {
    local_45[0] = (char)pHVar4->magic;
    local_45[1] = *(undefined1 *)((long)&pHVar4->magic + 1);
    local_45[2] = *(undefined1 *)((long)&pHVar4->magic + 2);
    local_45[3] = *(undefined1 *)((long)&pHVar4->magic + 3);
    local_41 = 0;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar7 = strlen(local_45);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_45,local_45 + sVar7);
    std::operator+(&local_68,"Invalid MD2 magic word: should be IDP2, the magic word found is ",
                   &local_40);
    std::runtime_error::runtime_error(prVar6,(string *)&local_68);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pHVar4->version != 8) {
    pLVar5 = DefaultLogger::get();
    Logger::warn(pLVar5,"Unsupported md2 file version. Continuing happily ...");
  }
  pHVar4 = this->m_pcHeader;
  uVar1 = pHVar4->numFrames;
  if (uVar1 == 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid md2 file: NUM_FRAMES is 0","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_68);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = this->fileSize;
  uVar8 = (ulong)uVar2;
  if (uVar2 < pHVar4->offsetEnd) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid md2 file: File is too small","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_68);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = pHVar4->numSkins;
  if (0x400000 < (ulong)uVar3) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid MD2 header: too many skins, would overflow","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_68);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x4000000 < pHVar4->numVertices) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid MD2 header: too many vertices, would overflow","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_68);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)pHVar4->numTexCoords < 0x4000001) {
    if (0x1555555 < (ulong)pHVar4->numTriangles) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid MD2 header: too many triangles, would overflow","");
      std::runtime_error::runtime_error(prVar6,(string *)&local_68);
      *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (uVar1 < 0x5d1746) {
      if (((ulong)uVar3 * 0x40 + (ulong)pHVar4->offsetSkins < uVar8) &&
         ((ulong)pHVar4->offsetTexCoords + (ulong)pHVar4->numTexCoords * 4 < uVar8)) {
        if (((ulong)pHVar4->offsetTriangles + (ulong)pHVar4->numTriangles * 0xc < uVar8) &&
           ((pHVar4->numVertices * 4 + 0x28) * uVar1 + pHVar4->offsetFrames < uVar2)) {
          if (0x20 < uVar3) {
            pLVar5 = DefaultLogger::get();
            Logger::warn(pLVar5,"The model contains more skins than Quake 2 supports");
          }
          if (0x200 < this->m_pcHeader->numFrames) {
            pLVar5 = DefaultLogger::get();
            Logger::warn(pLVar5,"The model contains more frames than Quake 2 supports");
          }
          if (0x800 < this->m_pcHeader->numVertices) {
            pLVar5 = DefaultLogger::get();
            Logger::warn(pLVar5,"The model contains more vertices than Quake 2 supports");
          }
          if (this->configFrameID < this->m_pcHeader->numFrames) {
            return;
          }
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"The requested frame is not existing the file","");
          std::runtime_error::runtime_error(prVar6,(string *)&local_68);
          *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
          __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Invalid MD2 header: some offsets are outside the file","");
      std::runtime_error::runtime_error(prVar6,(string *)&local_68);
      *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
      __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid MD2 header: too many frames, would overflow","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_68);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Invalid MD2 header: too many texcoords, would overflow","");
  std::runtime_error::runtime_error(prVar6,(string *)&local_68);
  *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD2Importer::ValidateHeader( )
{
    // check magic number
    if (m_pcHeader->magic != AI_MD2_MAGIC_NUMBER_BE &&
        m_pcHeader->magic != AI_MD2_MAGIC_NUMBER_LE)
    {
        char szBuffer[5];
        szBuffer[0] = ((char*)&m_pcHeader->magic)[0];
        szBuffer[1] = ((char*)&m_pcHeader->magic)[1];
        szBuffer[2] = ((char*)&m_pcHeader->magic)[2];
        szBuffer[3] = ((char*)&m_pcHeader->magic)[3];
        szBuffer[4] = '\0';

        throw DeadlyImportError("Invalid MD2 magic word: should be IDP2, the "
            "magic word found is " + std::string(szBuffer));
    }

    // check file format version
    if (m_pcHeader->version != 8)
        ASSIMP_LOG_WARN( "Unsupported md2 file version. Continuing happily ...");

    // check some values whether they are valid
    if (0 == m_pcHeader->numFrames)
        throw DeadlyImportError( "Invalid md2 file: NUM_FRAMES is 0");

    if (m_pcHeader->offsetEnd > (uint32_t)fileSize)
        throw DeadlyImportError( "Invalid md2 file: File is too small");

    if (m_pcHeader->numSkins > AI_MAX_ALLOC(MD2::Skin)) {
        throw DeadlyImportError("Invalid MD2 header: too many skins, would overflow");
    }

    if (m_pcHeader->numVertices > AI_MAX_ALLOC(MD2::Vertex)) {
        throw DeadlyImportError("Invalid MD2 header: too many vertices, would overflow");
    }

    if (m_pcHeader->numTexCoords > AI_MAX_ALLOC(MD2::TexCoord)) {
        throw DeadlyImportError("Invalid MD2 header: too many texcoords, would overflow");
    }

    if (m_pcHeader->numTriangles > AI_MAX_ALLOC(MD2::Triangle)) {
        throw DeadlyImportError("Invalid MD2 header: too many triangles, would overflow");
    }

    if (m_pcHeader->numFrames > AI_MAX_ALLOC(MD2::Frame)) {
        throw DeadlyImportError("Invalid MD2 header: too many frames, would overflow");
    }

    // -1 because Frame already contains one
    unsigned int frameSize = sizeof (MD2::Frame) + (m_pcHeader->numVertices - 1) * sizeof(MD2::Vertex);

    if (m_pcHeader->offsetSkins     + m_pcHeader->numSkins * sizeof (MD2::Skin)         >= fileSize ||
        m_pcHeader->offsetTexCoords + m_pcHeader->numTexCoords * sizeof (MD2::TexCoord) >= fileSize ||
        m_pcHeader->offsetTriangles + m_pcHeader->numTriangles * sizeof (MD2::Triangle) >= fileSize ||
        m_pcHeader->offsetFrames    + m_pcHeader->numFrames * frameSize                 >= fileSize ||
        m_pcHeader->offsetEnd           > fileSize)
    {
        throw DeadlyImportError("Invalid MD2 header: some offsets are outside the file");
    }

    if (m_pcHeader->numSkins > AI_MD2_MAX_SKINS)
        ASSIMP_LOG_WARN("The model contains more skins than Quake 2 supports");
    if ( m_pcHeader->numFrames > AI_MD2_MAX_FRAMES)
        ASSIMP_LOG_WARN("The model contains more frames than Quake 2 supports");
    if (m_pcHeader->numVertices > AI_MD2_MAX_VERTS)
        ASSIMP_LOG_WARN("The model contains more vertices than Quake 2 supports");

    if (m_pcHeader->numFrames <= configFrameID )
        throw DeadlyImportError("The requested frame is not existing the file");
}